

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O1

void Of_ObjMergeOrder(Of_Man_t *p,int iObj)

{
  uint uVar1;
  uint uVar2;
  Gia_Man_t *pGVar3;
  Gia_Obj_t *pGVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  Gia_Obj_t *pGVar7;
  Of_Cut_t *pOVar8;
  Of_Cut_t *pOVar9;
  Of_Cut_t *pOVar10;
  Vec_Mem_t *pVVar11;
  word **ppwVar12;
  int iVar13;
  word wVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined4 uVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  void *pvVar24;
  void **ppvVar25;
  byte bVar26;
  ulong uVar27;
  long lVar28;
  uint uVar29;
  uint uVar30;
  Of_Cut_t *pOVar31;
  ulong uVar32;
  ulong uVar33;
  int iVar34;
  int *piVar35;
  long lVar36;
  int iVar37;
  Of_Cut_t *pOVar38;
  ulong uVar39;
  int *piVar40;
  uint uVar41;
  undefined *puVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  int iVar47;
  uint uVar48;
  word *pwVar49;
  uint uVar50;
  uint *puVar52;
  int iVar53;
  int iVar54;
  Of_Cut_t *pCutsR [32];
  Of_Cut_t pCuts2 [32];
  Of_Cut_t pCuts0 [32];
  Of_Cut_t pCuts1 [32];
  Of_Cut_t pCuts [32];
  Of_Cut_t *local_19b8;
  uint local_1988;
  uint local_195c;
  ulong local_1958;
  Of_Cut_t *local_1950;
  ulong local_1948;
  Of_Cut_t *local_1940;
  Of_Cut_t *local_1938 [32];
  Of_Cut_t local_1838 [32];
  Of_Cut_t local_1238 [32];
  Of_Cut_t local_c38 [32];
  Of_Cut_t local_638 [32];
  ulong uVar51;
  
  if ((iObj < 0) || (pGVar3 = p->pGia, pGVar3->nObjs <= iObj)) {
LAB_00750a22:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                  ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar4 = pGVar3->pObjs;
  iVar54 = pGVar3->pRefs[(uint)iObj];
  uVar1 = p->pPars->nLutSize;
  uVar22 = p->pPars->nCutNum;
  iVar18 = Of_ManPrepareCuts(local_1238,p,iObj - (*(uint *)(pGVar4 + (uint)iObj) & 0x1fffffff),1);
  iVar19 = Of_ManPrepareCuts(local_c38,p,
                             iObj - (*(uint *)&pGVar4[(uint)iObj].field_0x4 & 0x1fffffff),1);
  uVar23 = *(ulong *)(pGVar4 + (uint)iObj);
  pGVar3 = p->pGia;
  if (pGVar3->pSibls == (int *)0x0) {
    uVar30 = 0;
  }
  else {
    uVar30 = pGVar3->pSibls[(uint)iObj];
  }
  uVar29 = (uint)uVar23 & 0x1fffffff;
  uVar20 = (uint)(uVar23 >> 0x20);
  if ((-1 < (int)(uint)uVar23 && uVar29 != 0x1fffffff) && uVar29 == (uVar20 & 0x1fffffff)) {
    __assert_fail("!Gia_ObjIsBuf(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaOf.c"
                  ,0x2ba,"void Of_ObjMergeOrder(Of_Man_t *, int)");
  }
  if (0 < (int)uVar22) {
    pOVar31 = local_638;
    uVar39 = 0;
    do {
      local_1938[uVar39] = pOVar31;
      uVar39 = uVar39 + 1;
      pOVar31 = pOVar31 + 1;
    } while (uVar22 != uVar39);
  }
  pGVar4 = pGVar4 + (uint)iObj;
  iVar54 = iVar54 * 2;
  if (uVar30 == 0) {
    uVar30 = 0;
  }
  else {
    iVar21 = pGVar3->pSibls[(uint)iObj];
    if (((long)iVar21 < 0) || (pGVar3->nObjs <= iVar21)) goto LAB_00750a22;
    if (((int)uVar30 < 0) || ((p->vCutSets).nSize <= (int)uVar30)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    uVar5 = *(undefined8 *)(pGVar3->pObjs + iVar21);
    uVar6 = *(undefined8 *)pGVar4;
    uVar29 = (p->vCutSets).pArray[uVar30];
    if ((int)uVar29 < 1) {
      local_1838[0].Delay = 0;
      local_1838[0].Flow = 0;
      local_1838[0]._16_4_ = 0x8000002;
      local_1838[0].pLeaves[0] = uVar30;
      local_1838[0].Sign = 1L << ((byte)uVar30 & 0x3f);
      iVar21 = 1;
    }
    else {
      if ((p->vPages).nSize <= (int)(uVar29 >> 0x10)) goto LAB_00750a41;
      pvVar24 = (p->vPages).pArray[uVar29 >> 0x10];
      iVar21 = *(int *)((long)pvVar24 + (ulong)(uVar29 & 0xffff) * 4);
      if (0 < iVar21) {
        piVar40 = (int *)((long)pvVar24 + (ulong)(uVar29 & 0xffff) * 4);
        puVar52 = (uint *)(piVar40 + 1);
        pOVar31 = local_1838;
        iVar53 = 0;
        do {
          pOVar31->Delay = 0;
          pOVar31->Flow = 0;
          uVar30 = *puVar52;
          *(uint *)&pOVar31->field_0x10 = *(uint *)&pOVar31->field_0x10 & 0xf8000000 | uVar30 >> 5;
          *(uint *)&pOVar31->field_0x10 = *puVar52 << 0x1b | uVar30 >> 5;
          uVar30 = *puVar52 & 0x1f;
          if (uVar30 == 0) {
            uVar39 = 0;
          }
          else {
            uVar27 = 0;
            uVar39 = 0;
            do {
              uVar39 = uVar39 | 1L << ((ulong)(byte)(puVar52 + 1)[uVar27] & 0x3f);
              uVar27 = uVar27 + 1;
            } while (uVar30 != uVar27);
          }
          pOVar31->Sign = uVar39;
          memcpy(pOVar31->pLeaves,puVar52 + 1,(ulong)(uVar30 << 2));
          pOVar31 = pOVar31 + 1;
          iVar53 = iVar53 + 1;
          puVar52 = puVar52 + (ulong)(*puVar52 & 0x1f) + 4;
          iVar21 = *piVar40;
        } while (iVar53 < iVar21);
      }
    }
    if (iVar21 < 1) {
      uVar30 = 0;
    }
    else {
      pOVar31 = local_1838;
      uVar30 = 0;
      do {
        pOVar38 = local_1938[(int)uVar30];
        wVar14 = pOVar31->Sign;
        iVar37 = pOVar31->Delay;
        iVar34 = pOVar31->Flow;
        uVar17 = *(undefined4 *)&pOVar31->field_0x10;
        iVar53 = pOVar31->pLeaves[0];
        uVar15 = *(undefined8 *)(pOVar31->pLeaves + 1);
        uVar16 = *(undefined8 *)(pOVar31->pLeaves + 5);
        *(undefined8 *)(pOVar38->pLeaves + 3) = *(undefined8 *)(pOVar31->pLeaves + 3);
        *(undefined8 *)(pOVar38->pLeaves + 5) = uVar16;
        *(undefined4 *)&pOVar38->field_0x10 = uVar17;
        pOVar38->pLeaves[0] = iVar53;
        *(undefined8 *)(pOVar38->pLeaves + 1) = uVar15;
        pOVar38->Sign = wVar14;
        pOVar38->Delay = iVar37;
        pOVar38->Flow = iVar34;
        if (p->pPars->fCutMin != 0) {
          *(uint *)&pOVar38->field_0x10 =
               *(uint *)&pOVar38->field_0x10 & 0xf8000000 |
               *(uint *)&pOVar38->field_0x10 & 0x7ffffff ^
               ((uint)((ulong)uVar5 >> 0x20) ^ (uint)((ulong)uVar6 >> 0x20)) >> 0x1f;
        }
        Of_CutParams(p,pOVar38,iVar54);
        uVar30 = Of_SetAddCut(local_1938,uVar30,uVar22);
        pOVar31 = pOVar31 + 1;
      } while (pOVar31 < local_1838 + iVar21);
    }
  }
  uVar29 = (uint)(uVar23 >> 0x1d) & 1;
  local_1948 = (ulong)(uVar20 >> 0x1d & 1);
  local_1950 = local_1238 + iVar18;
  local_1940 = local_c38 + iVar19;
  puVar52 = p->pGia->pMuxes;
  if ((puVar52 == (uint *)0x0) || (puVar52[(uint)iObj] == 0)) {
    uVar5 = *(undefined8 *)pGVar4;
    uVar20 = (uint)uVar5;
    p->CutCount[0] = (double)(iVar19 * iVar18) + p->CutCount[0];
    if (0 < iVar18) {
      local_1988 = uVar1 << 0x1b | 0x7ffffff;
      piVar40 = local_1238[0].pLeaves;
      pOVar31 = local_1238;
      do {
        if (0 < iVar19) {
          piVar35 = local_c38[0].pLeaves;
          pOVar38 = local_c38;
          do {
            uVar45 = *(uint *)&pOVar31->field_0x10;
            uVar43 = uVar45 >> 0x1b;
            uVar48 = *(uint *)&pOVar38->field_0x10;
            uVar44 = uVar48 >> 0x1b;
            if (((int)uVar1 < (int)(uVar44 + uVar43)) &&
               (uVar23 = pOVar38->Sign | pOVar31->Sign,
               uVar23 = uVar23 - (uVar23 >> 1 & 0x5555555555555555),
               uVar23 = (uVar23 >> 2 & 0x3333333333333333) + (uVar23 & 0x3333333333333333),
               (int)uVar1 <
               (int)(uint)(byte)(((uVar23 >> 4) + uVar23 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                                0x38))) goto LAB_0074fd93;
            p->CutCount[1] = p->CutCount[1] + 1.0;
            pOVar8 = local_1938[(int)uVar30];
            if ((uVar43 != uVar1) || (uVar44 != uVar1)) {
              iVar18 = 0;
              iVar21 = 0;
              if (uVar45 < 0x8000000) {
LAB_0074f796:
                if ((int)(iVar21 + uVar44) <= (int)(uVar1 + iVar18)) {
                  if (iVar18 < (int)uVar44) {
                    lVar36 = 0;
                    do {
                      pOVar8->pLeaves[iVar21 + lVar36] = piVar35[iVar18 + lVar36];
                      lVar36 = lVar36 + 1;
                    } while ((ulong)uVar44 - (long)iVar18 != lVar36);
LAB_0074f82b:
                    iVar21 = iVar21 + (int)lVar36;
                  }
LAB_0074f82d:
                  *(uint *)&pOVar8->field_0x10 = iVar21 << 0x1b | 0x7ffffff;
                  goto LAB_0074f839;
                }
              }
              else {
                iVar53 = 0;
                iVar21 = 0;
                if (uVar48 < 0x8000000) {
LAB_0074f7ea:
                  if ((int)(iVar21 + uVar43) <= (int)(uVar1 + iVar53)) {
                    if (iVar53 < (int)uVar43) {
                      lVar36 = 0;
                      do {
                        pOVar8->pLeaves[iVar21 + lVar36] = piVar40[iVar53 + lVar36];
                        lVar36 = lVar36 + 1;
                      } while ((ulong)uVar43 - (long)iVar53 != lVar36);
                      goto LAB_0074f82b;
                    }
                    goto LAB_0074f82d;
                  }
                }
                else if ((ulong)uVar1 != 0) {
                  lVar36 = 0;
                  iVar53 = 0;
                  iVar21 = 0;
                  do {
                    iVar18 = pOVar31->pLeaves[iVar53];
                    iVar37 = pOVar38->pLeaves[iVar21];
                    if (iVar18 < iVar37) {
                      iVar53 = iVar53 + 1;
                      pOVar8->pLeaves[lVar36] = iVar18;
                      iVar18 = iVar21;
                      if ((int)uVar43 <= iVar53) {
LAB_0074fdab:
                        iVar21 = (int)lVar36 + 1;
                        goto LAB_0074f796;
                      }
                    }
                    else {
                      if (iVar37 < iVar18) {
                        pOVar8->pLeaves[lVar36] = iVar37;
                      }
                      else {
                        iVar53 = iVar53 + 1;
                        pOVar8->pLeaves[lVar36] = iVar18;
                        iVar18 = iVar21 + 1;
                        if ((int)uVar43 <= iVar53) goto LAB_0074fdab;
                      }
                      iVar21 = iVar21 + 1;
                      if ((int)uVar44 <= iVar21) {
                        iVar21 = (int)lVar36 + 1;
                        goto LAB_0074f7ea;
                      }
                    }
                    lVar36 = lVar36 + 1;
                  } while (uVar1 != (uint)lVar36);
                }
              }
              goto LAB_0074fd93;
            }
            if (0x7ffffff < uVar45) {
              uVar23 = 0;
              do {
                if (piVar40[uVar23] != piVar35[uVar23]) goto LAB_0074fd93;
                pOVar8->pLeaves[uVar23] = piVar40[uVar23];
                uVar23 = uVar23 + 1;
              } while (uVar43 != uVar23);
            }
            *(uint *)&pOVar8->field_0x10 = local_1988;
LAB_0074f839:
            pOVar8->Sign = pOVar38->Sign | pOVar31->Sign;
            if (0 < (int)uVar30) {
              pOVar9 = local_1938[uVar30];
              uVar45 = *(uint *)&pOVar9->field_0x10 >> 0x1b;
              uVar23 = 0;
              do {
                pOVar10 = local_1938[uVar23];
                uVar48 = *(uint *)&pOVar10->field_0x10 >> 0x1b;
                if ((uVar48 <= uVar45) && ((pOVar10->Sign & ~pOVar9->Sign) == 0)) {
                  if (uVar45 == uVar48) {
                    if (*(uint *)&pOVar9->field_0x10 < 0x8000000) goto LAB_0074fd93;
                    uVar39 = 0;
                    while (pOVar9->pLeaves[uVar39] == pOVar10->pLeaves[uVar39]) {
                      uVar39 = uVar39 + 1;
                      if (uVar45 == uVar39) goto LAB_0074fd93;
                    }
                  }
                  else {
                    if (uVar45 <= uVar48) {
LAB_00750949:
                      __assert_fail("nSizeB > nSizeC",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaOf.c"
                                    ,0x253,"int Of_SetCutIsContainedOrder(Of_Cut_t *, Of_Cut_t *)");
                    }
                    if (*(uint *)&pOVar10->field_0x10 < 0x8000000) goto LAB_0074fd93;
                    uVar39 = 0;
                    uVar43 = 0;
                    do {
                      if (pOVar10->pLeaves[(int)uVar43] < pOVar9->pLeaves[uVar39]) break;
                      if ((pOVar9->pLeaves[uVar39] == pOVar10->pLeaves[(int)uVar43]) &&
                         (uVar43 = uVar43 + 1, uVar43 == uVar48)) goto LAB_0074fd93;
                      uVar39 = uVar39 + 1;
                    } while (uVar45 != uVar39);
                  }
                }
                uVar23 = uVar23 + 1;
              } while (uVar23 != uVar30);
            }
            p->CutCount[2] = p->CutCount[2] + 1.0;
            if (p->pPars->fCutMin == 0) goto LAB_0074fd56;
            pVVar11 = p->vTtMem;
            uVar45 = *(uint *)&pOVar31->field_0x10;
            uVar48 = uVar45 >> 1 & 0x3ffffff;
            if (pVVar11->nEntries <= (int)uVar48) {
LAB_0075092a:
              __assert_fail("i >= 0 && i < p->nEntries",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecMem.h"
                            ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
            }
            uVar43 = *(uint *)&pOVar38->field_0x10;
            uVar44 = uVar43 >> 1 & 0x3ffffff;
            if (pVVar11->nEntries <= (int)uVar44) goto LAB_0075092a;
            uVar46 = *(uint *)&pOVar8->field_0x10;
            bVar26 = (byte)pVVar11->LogPageSze;
            uVar41 = uVar46 >> 0x1b;
            uVar23 = (ulong)uVar41;
            uVar39 = -(ulong)((uVar45 & 1) != uVar29) ^
                     pVVar11->ppPages[uVar48 >> (bVar26 & 0x1f)]
                     [(int)((uVar48 & pVVar11->PageMask) * pVVar11->nEntrySize)];
            uVar27 = -(ulong)((uVar43 & 1) != (uint)local_1948) ^
                     pVVar11->ppPages[uVar44 >> (bVar26 & 0x1f)]
                     [(int)((pVVar11->PageMask & uVar44) * pVVar11->nEntrySize)];
            uVar48 = (uVar45 >> 0x1b) - 1;
            if (0x7ffffff < uVar45 && 0x7ffffff < uVar46) {
              puVar42 = &UNK_009fc398 + uVar23 * 0x18;
              uVar51 = uVar23;
              do {
                uVar32 = uVar51 - 1;
                if (pOVar8->pLeaves[uVar51 - 1] <= pOVar31->pLeaves[uVar48]) {
                  if (pOVar8->pLeaves[uVar51 - 1] != pOVar31->pLeaves[uVar48]) goto LAB_007508ec;
                  if ((long)(int)uVar48 < (long)uVar32) {
                    bVar26 = (char)(-1 << ((byte)uVar48 & 0x1f)) +
                             (char)(1 << ((byte)uVar32 & 0x1f));
                    lVar36 = (ulong)uVar48 * 0x90;
                    uVar39 = (uVar39 & *(ulong *)(puVar42 + lVar36)) >> (bVar26 & 0x3f) |
                             (*(ulong *)(puVar42 + lVar36 + -8) & uVar39) << (bVar26 & 0x3f) |
                             *(ulong *)(puVar42 + lVar36 + -0x10) & uVar39;
                  }
                  uVar48 = uVar48 - 1;
                }
              } while ((1 < (long)uVar51) &&
                      (puVar42 = puVar42 + -0x18, uVar51 = uVar32, -1 < (int)uVar48));
            }
            if (uVar48 != 0xffffffff) {
LAB_0075090b:
              __assert_fail("k == -1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                            ,0x63b,"word Abc_Tt6Expand(word, int *, int, int *, int)");
            }
            uVar45 = (uVar43 >> 0x1b) - 1;
            if (0x7ffffff < uVar43 && 0x7ffffff < uVar46) {
              puVar42 = &UNK_009fc398 + uVar23 * 0x18;
              uVar51 = uVar23;
              do {
                uVar32 = uVar51 - 1;
                if (pOVar8->pLeaves[uVar51 - 1] <= pOVar38->pLeaves[uVar45]) {
                  if (pOVar8->pLeaves[uVar51 - 1] != pOVar38->pLeaves[uVar45]) {
LAB_007508ec:
                    __assert_fail("pCut[i] == pCut0[k]",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                                  ,0x636,"word Abc_Tt6Expand(word, int *, int, int *, int)");
                  }
                  if ((long)(int)uVar45 < (long)uVar32) {
                    bVar26 = (char)(-1 << ((byte)uVar45 & 0x1f)) +
                             (char)(1 << ((byte)uVar32 & 0x1f));
                    lVar36 = (ulong)uVar45 * 0x90;
                    uVar27 = (uVar27 & *(ulong *)(puVar42 + lVar36)) >> (bVar26 & 0x3f) |
                             (*(ulong *)(puVar42 + lVar36 + -8) & uVar27) << (bVar26 & 0x3f) |
                             *(ulong *)(puVar42 + lVar36 + -0x10) & uVar27;
                  }
                  uVar45 = uVar45 - 1;
                }
              } while ((1 < (long)uVar51) &&
                      (puVar42 = puVar42 + -0x18, uVar51 = uVar32, -1 < (int)uVar45));
            }
            if (uVar45 != 0xffffffff) goto LAB_0075090b;
            local_1838[0].Sign = uVar27 & uVar39;
            if (((~uVar20 & 0x1fffffff) != 0 && -1 < (int)uVar20) &&
                (uVar20 & 0x1fffffff) < ((uint)((ulong)uVar5 >> 0x20) & 0x1fffffff)) {
              local_1838[0].Sign = uVar27 ^ uVar39;
            }
            uVar45 = (uint)local_1838[0].Sign & 1;
            local_1838[0].Sign = -(ulong)uVar45 ^ local_1838[0].Sign;
            uVar48 = 0;
            uVar39 = local_1838[0].Sign;
            if (0x7ffffff < uVar46) {
              uVar27 = 0;
              lVar36 = 0x9fc3a8;
              pwVar49 = s_Truths6Neg;
              uVar48 = 0;
              do {
                bVar26 = (byte)(1 << ((byte)uVar27 & 0x1f));
                if ((*pwVar49 & (uVar39 >> (bVar26 & 0x3f) ^ uVar39)) != 0) {
                  lVar28 = (long)(int)uVar48;
                  if (lVar28 < (long)uVar27) {
                    pOVar8->pLeaves[lVar28] = pOVar8->pLeaves[uVar27];
                    bVar26 = (char)(-1 << ((byte)uVar48 & 0x1f)) + bVar26;
                    lVar28 = lVar28 * 0x90;
                    uVar39 = (uVar39 & *(ulong *)(lVar36 + 8 + lVar28)) >> (bVar26 & 0x3f) |
                             (*(ulong *)(lVar36 + lVar28) & uVar39) << (bVar26 & 0x3f) |
                             *(ulong *)(lVar36 + -8 + lVar28) & uVar39;
                  }
                  uVar48 = uVar48 + 1;
                }
                uVar27 = uVar27 + 1;
                pwVar49 = pwVar49 + 1;
                lVar36 = lVar36 + 0x18;
              } while (uVar23 != uVar27);
            }
            uVar23 = local_1838[0].Sign;
            if ((uVar48 != uVar41) &&
               (uVar27 = local_1958, uVar23 = uVar39, (int)uVar41 <= (int)uVar48)) {
LAB_007509c5:
              local_1958 = uVar27;
              __assert_fail("k < nVars",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                            ,0x65d,"int Abc_Tt6MinBase(word *, int *, int)");
            }
            local_1838[0].Sign = uVar23;
            *(uint *)&pOVar8->field_0x10 = *(uint *)&pOVar8->field_0x10 & 0x7ffffff | uVar48 << 0x1b
            ;
            if ((local_1838[0].Sign & 1) != 0) {
              __assert_fail("(int)(t & 1) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaOf.c"
                            ,0x120,
                            "int Of_CutComputeTruth6(Of_Man_t *, Of_Cut_t *, Of_Cut_t *, int, int, Of_Cut_t *, int)"
                           );
            }
            uVar48 = Vec_MemHashInsert(p->vTtMem,&local_1838[0].Sign);
            if ((int)uVar48 < 0) {
LAB_00750968:
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                            ,0x12e,"int Abc_Var2Lit(int, int)");
            }
            uVar43 = *(uint *)&pOVar8->field_0x10;
            *(uint *)&pOVar8->field_0x10 = uVar43 & 0xf8000000 | uVar45 + (uVar48 & 0x3ffffff) * 2;
            if (uVar41 < uVar43 >> 0x1b) {
              __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaOf.c"
                            ,0x123,
                            "int Of_CutComputeTruth6(Of_Man_t *, Of_Cut_t *, Of_Cut_t *, int, int, Of_Cut_t *, int)"
                           );
            }
            if (uVar43 >> 0x1b < uVar41) {
              if (uVar43 < 0x8000000) {
                uVar23 = 0;
              }
              else {
                uVar39 = 0;
                uVar23 = 0;
                do {
                  uVar23 = uVar23 | 1L << ((ulong)(byte)pOVar8->pLeaves[uVar39] & 0x3f);
                  uVar39 = uVar39 + 1;
                } while (uVar43 >> 0x1b != uVar39);
              }
              pOVar8->Sign = uVar23;
            }
LAB_0074fd56:
            Of_CutParams(p,pOVar8,iVar54);
            uVar30 = Of_SetAddCut(local_1938,uVar30,uVar22);
LAB_0074fd93:
            pOVar38 = pOVar38 + 1;
            piVar35 = piVar35 + 0xc;
          } while (pOVar38 < local_1940);
        }
        pOVar31 = pOVar31 + 1;
        piVar40 = piVar40 + 0xc;
      } while (pOVar31 < local_1950);
    }
  }
  else {
    puVar52 = p->pGia->pMuxes;
    uVar20 = 0xffffffff;
    if (puVar52 != (uint *)0x0) {
      uVar45 = puVar52[(uint)iObj];
      if (uVar45 != 0) {
        if ((int)uVar45 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        uVar20 = uVar45 >> 1;
      }
    }
    pOVar31 = local_1238;
    iVar21 = Of_ManPrepareCuts(local_1838,p,uVar20,1);
    pGVar3 = p->pGia;
    if (pGVar3->pMuxes == (uint *)0x0) {
      local_195c = 0;
    }
    else {
      pGVar7 = pGVar3->pObjs;
      if ((pGVar4 < pGVar7) || (pGVar7 + pGVar3->nObjs <= pGVar4)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      local_195c = pGVar3->pMuxes[(int)((ulong)((long)pGVar4 - (long)pGVar7) >> 2) * -0x55555555];
      if ((int)local_195c < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x130,"int Abc_LitIsCompl(int)");
      }
      local_195c = local_195c & 1;
    }
    p->CutCount[0] = (double)(iVar19 * iVar18 * iVar21) + p->CutCount[0];
    if (0 < iVar18) {
      do {
        if (0 < iVar19) {
          local_19b8 = local_c38;
          do {
            if (0 < iVar21) {
              pOVar38 = local_1838;
              do {
                uVar23 = local_19b8->Sign | pOVar31->Sign | pOVar38->Sign;
                uVar23 = uVar23 - (uVar23 >> 1 & 0x5555555555555555);
                uVar23 = (uVar23 >> 2 & 0x3333333333333333) + (uVar23 & 0x3333333333333333);
                if ((int)(uint)(byte)(((uVar23 >> 4) + uVar23 & 0xf0f0f0f0f0f0f0f) *
                                      0x101010101010101 >> 0x38) <= (int)uVar1) {
                  p->CutCount[1] = p->CutCount[1] + 1.0;
                  pOVar8 = local_1938[(int)uVar30];
                  uVar20 = *(uint *)&pOVar31->field_0x10;
                  uVar45 = *(uint *)&local_19b8->field_0x10;
                  uVar48 = *(uint *)&pOVar38->field_0x10;
                  uVar23 = 0;
                  iVar18 = 0x7ffffff;
                  uVar43 = 0;
                  uVar44 = 0;
                  uVar46 = 0;
                  while( true ) {
                    iVar37 = 1000000000;
                    iVar53 = 1000000000;
                    if (uVar46 != uVar20 >> 0x1b) {
                      iVar53 = pOVar31->pLeaves[uVar46];
                    }
                    if (uVar44 != uVar45 >> 0x1b) {
                      iVar37 = local_19b8->pLeaves[uVar44];
                    }
                    iVar34 = 1000000000;
                    if (uVar43 != uVar48 >> 0x1b) {
                      iVar34 = pOVar38->pLeaves[uVar43];
                    }
                    iVar47 = iVar37;
                    if (iVar53 < iVar37) {
                      iVar47 = iVar53;
                    }
                    iVar13 = iVar34;
                    if (iVar47 < iVar34) {
                      iVar13 = iVar47;
                    }
                    if (iVar13 == 1000000000) break;
                    if (uVar1 == uVar23) goto LAB_00750065;
                    pOVar8->pLeaves[uVar23] = iVar13;
                    uVar23 = uVar23 + 1;
                    uVar46 = uVar46 + (iVar53 == iVar13);
                    uVar44 = uVar44 + (iVar37 == iVar13);
                    uVar43 = uVar43 + (iVar34 <= iVar47);
                    iVar18 = iVar18 + 0x8000000;
                  }
                  *(int *)&pOVar8->field_0x10 = iVar18;
                  pOVar8->Sign = local_19b8->Sign | pOVar31->Sign | pOVar38->Sign;
LAB_00750065:
                  if (iVar13 == 1000000000) {
                    if (0 < (int)uVar30) {
                      pOVar9 = local_1938[uVar30];
                      uVar20 = *(uint *)&pOVar9->field_0x10 >> 0x1b;
                      uVar23 = 0;
                      do {
                        pOVar10 = local_1938[uVar23];
                        uVar45 = *(uint *)&pOVar10->field_0x10 >> 0x1b;
                        if ((uVar45 <= uVar20) && ((pOVar10->Sign & ~pOVar9->Sign) == 0)) {
                          if (uVar20 == uVar45) {
                            if (*(uint *)&pOVar9->field_0x10 < 0x8000000) goto LAB_00750697;
                            uVar39 = 0;
                            while (pOVar9->pLeaves[uVar39] == pOVar10->pLeaves[uVar39]) {
                              uVar39 = uVar39 + 1;
                              if (uVar20 == uVar39) goto LAB_00750697;
                            }
                          }
                          else {
                            if (uVar20 <= uVar45) goto LAB_00750949;
                            if (*(uint *)&pOVar10->field_0x10 < 0x8000000) goto LAB_00750697;
                            uVar39 = 0;
                            uVar48 = 0;
                            do {
                              if (pOVar10->pLeaves[(int)uVar48] < pOVar9->pLeaves[uVar39]) break;
                              if ((pOVar9->pLeaves[uVar39] == pOVar10->pLeaves[(int)uVar48]) &&
                                 (uVar48 = uVar48 + 1, uVar48 == uVar45)) goto LAB_00750697;
                              uVar39 = uVar39 + 1;
                            } while (uVar20 != uVar39);
                          }
                        }
                        uVar23 = uVar23 + 1;
                      } while (uVar23 != uVar30);
                    }
                    p->CutCount[2] = p->CutCount[2] + 1.0;
                    if (p->pPars->fCutMin != 0) {
                      pVVar11 = p->vTtMem;
                      uVar20 = *(uint *)&pOVar31->field_0x10;
                      uVar45 = uVar20 >> 1 & 0x3ffffff;
                      iVar18 = pVVar11->nEntries;
                      if (iVar18 <= (int)uVar45) goto LAB_0075092a;
                      bVar26 = (byte)pVVar11->LogPageSze;
                      uVar48 = *(uint *)&local_19b8->field_0x10;
                      uVar43 = uVar48 >> 1 & 0x3ffffff;
                      if (iVar18 <= (int)uVar43) goto LAB_0075092a;
                      uVar44 = *(uint *)&pOVar38->field_0x10;
                      uVar46 = uVar44 >> 1 & 0x3ffffff;
                      if (iVar18 <= (int)uVar46) goto LAB_0075092a;
                      uVar41 = *(uint *)&pOVar8->field_0x10;
                      uVar50 = uVar41 >> 0x1b;
                      uVar51 = (ulong)uVar50;
                      ppwVar12 = pVVar11->ppPages;
                      iVar18 = pVVar11->nEntrySize;
                      uVar2 = pVVar11->PageMask;
                      uVar27 = -(ulong)((uVar20 & 1) != uVar29) ^
                               ppwVar12[uVar45 >> (bVar26 & 0x1f)][(int)((uVar45 & uVar2) * iVar18)]
                      ;
                      uVar23 = -(ulong)((uVar48 & 1) != (uint)local_1948) ^
                               ppwVar12[uVar43 >> (bVar26 & 0x1f)][(int)((uVar43 & uVar2) * iVar18)]
                      ;
                      uVar39 = -(ulong)((uVar44 & 1) != local_195c) ^
                               ppwVar12[uVar46 >> (bVar26 & 0x1f)][(int)((uVar46 & uVar2) * iVar18)]
                      ;
                      uVar45 = (uVar20 >> 0x1b) - 1;
                      if (0x7ffffff < uVar20 && 0x7ffffff < uVar41) {
                        puVar42 = &UNK_009fc398 + uVar51 * 0x18;
                        uVar32 = uVar51;
                        do {
                          uVar33 = uVar32 - 1;
                          if (pOVar8->pLeaves[uVar32 - 1] <= pOVar31->pLeaves[uVar45]) {
                            if (pOVar8->pLeaves[uVar32 - 1] != pOVar31->pLeaves[uVar45])
                            goto LAB_007508ec;
                            if ((long)(int)uVar45 < (long)uVar33) {
                              bVar26 = (char)(-1 << ((byte)uVar45 & 0x1f)) +
                                       (char)(1 << ((byte)uVar33 & 0x1f));
                              lVar36 = (ulong)uVar45 * 0x90;
                              uVar27 = (uVar27 & *(ulong *)(puVar42 + lVar36)) >> (bVar26 & 0x3f) |
                                       (*(ulong *)(puVar42 + lVar36 + -8) & uVar27) <<
                                       (bVar26 & 0x3f) |
                                       *(ulong *)(puVar42 + lVar36 + -0x10) & uVar27;
                            }
                            uVar45 = uVar45 - 1;
                          }
                        } while ((1 < (long)uVar32) &&
                                (puVar42 = puVar42 + -0x18, uVar32 = uVar33, -1 < (int)uVar45));
                      }
                      if (uVar45 != 0xffffffff) goto LAB_0075090b;
                      uVar20 = (uVar48 >> 0x1b) - 1;
                      if (0x7ffffff < uVar48 && 0x7ffffff < uVar41) {
                        puVar42 = &UNK_009fc398 + uVar51 * 0x18;
                        uVar32 = uVar51;
                        do {
                          uVar33 = uVar32 - 1;
                          if (pOVar8->pLeaves[uVar32 - 1] <= local_19b8->pLeaves[uVar20]) {
                            if (pOVar8->pLeaves[uVar32 - 1] != local_19b8->pLeaves[uVar20])
                            goto LAB_007508ec;
                            if ((long)(int)uVar20 < (long)uVar33) {
                              bVar26 = (char)(-1 << ((byte)uVar20 & 0x1f)) +
                                       (char)(1 << ((byte)uVar33 & 0x1f));
                              lVar36 = (ulong)uVar20 * 0x90;
                              uVar23 = (uVar23 & *(ulong *)(puVar42 + lVar36)) >> (bVar26 & 0x3f) |
                                       (*(ulong *)(puVar42 + lVar36 + -8) & uVar23) <<
                                       (bVar26 & 0x3f) |
                                       *(ulong *)(puVar42 + lVar36 + -0x10) & uVar23;
                            }
                            uVar20 = uVar20 - 1;
                          }
                        } while ((1 < (long)uVar32) &&
                                (puVar42 = puVar42 + -0x18, uVar32 = uVar33, -1 < (int)uVar20));
                      }
                      if (uVar20 != 0xffffffff) goto LAB_0075090b;
                      uVar20 = (uVar44 >> 0x1b) - 1;
                      if (0x7ffffff < uVar44 && 0x7ffffff < uVar41) {
                        puVar42 = &UNK_009fc398 + uVar51 * 0x18;
                        uVar32 = uVar51;
                        do {
                          uVar33 = uVar32 - 1;
                          if (pOVar8->pLeaves[uVar32 - 1] <= pOVar38->pLeaves[uVar20]) {
                            if (pOVar8->pLeaves[uVar32 - 1] != pOVar38->pLeaves[uVar20])
                            goto LAB_007508ec;
                            if ((long)(int)uVar20 < (long)uVar33) {
                              bVar26 = (char)(-1 << ((byte)uVar20 & 0x1f)) +
                                       (char)(1 << ((byte)uVar33 & 0x1f));
                              lVar36 = (ulong)uVar20 * 0x90;
                              uVar39 = (uVar39 & *(ulong *)(puVar42 + lVar36)) >> (bVar26 & 0x3f) |
                                       (*(ulong *)(puVar42 + lVar36 + -8) & uVar39) <<
                                       (bVar26 & 0x3f) |
                                       *(ulong *)(puVar42 + lVar36 + -0x10) & uVar39;
                            }
                            uVar20 = uVar20 - 1;
                          }
                        } while ((1 < (long)uVar32) &&
                                (puVar42 = puVar42 + -0x18, uVar32 = uVar33, -1 < (int)uVar20));
                      }
                      if (uVar20 != 0xffffffff) goto LAB_0075090b;
                      uVar27 = (uVar23 ^ uVar27) & uVar39 ^ uVar27;
                      uVar45 = (uint)uVar27 & 1;
                      uVar27 = -(ulong)uVar45 ^ uVar27;
                      uVar20 = 0;
                      uVar23 = uVar27;
                      if (0x7ffffff < uVar41) {
                        uVar39 = 0;
                        lVar36 = 0x9fc3a8;
                        pwVar49 = s_Truths6Neg;
                        uVar20 = 0;
                        do {
                          bVar26 = (byte)(1 << ((byte)uVar39 & 0x1f));
                          if ((*pwVar49 & (uVar23 >> (bVar26 & 0x3f) ^ uVar23)) != 0) {
                            lVar28 = (long)(int)uVar20;
                            if (lVar28 < (long)uVar39) {
                              pOVar8->pLeaves[lVar28] = pOVar8->pLeaves[uVar39];
                              bVar26 = (char)(-1 << ((byte)uVar20 & 0x1f)) + bVar26;
                              lVar28 = lVar28 * 0x90;
                              uVar23 = (uVar23 & *(ulong *)(lVar36 + 8 + lVar28)) >> (bVar26 & 0x3f)
                                       | (*(ulong *)(lVar36 + lVar28) & uVar23) << (bVar26 & 0x3f) |
                                         *(ulong *)(lVar36 + -8 + lVar28) & uVar23;
                            }
                            uVar20 = uVar20 + 1;
                          }
                          uVar39 = uVar39 + 1;
                          pwVar49 = pwVar49 + 1;
                          lVar36 = lVar36 + 0x18;
                        } while (uVar51 != uVar39);
                      }
                      local_1958 = uVar27;
                      if ((uVar20 != uVar50) && (local_1958 = uVar23, (int)uVar50 <= (int)uVar20))
                      goto LAB_007509c5;
                      *(uint *)&pOVar8->field_0x10 =
                           *(uint *)&pOVar8->field_0x10 & 0x7ffffff | uVar20 << 0x1b;
                      if ((local_1958 & 1) != 0) {
                        __assert_fail("(int)(t & 1) == 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaOf.c"
                                      ,0x135,
                                      "int Of_CutComputeTruthMux6(Of_Man_t *, Of_Cut_t *, Of_Cut_t *, Of_Cut_t *, int, int, int, Of_Cut_t *)"
                                     );
                      }
                      uVar20 = Vec_MemHashInsert(p->vTtMem,&local_1958);
                      if ((int)uVar20 < 0) goto LAB_00750968;
                      uVar48 = *(uint *)&pOVar8->field_0x10;
                      *(uint *)&pOVar8->field_0x10 =
                           uVar48 & 0xf8000000 | uVar45 + (uVar20 & 0x3ffffff) * 2;
                      if (uVar50 < uVar48 >> 0x1b) {
                        __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaOf.c"
                                      ,0x138,
                                      "int Of_CutComputeTruthMux6(Of_Man_t *, Of_Cut_t *, Of_Cut_t *, Of_Cut_t *, int, int, int, Of_Cut_t *)"
                                     );
                      }
                      if (uVar48 >> 0x1b < uVar50) {
                        if (uVar48 < 0x8000000) {
                          uVar23 = 0;
                        }
                        else {
                          uVar39 = 0;
                          uVar23 = 0;
                          do {
                            uVar23 = uVar23 | 1L << ((ulong)(byte)pOVar8->pLeaves[uVar39] & 0x3f);
                            uVar39 = uVar39 + 1;
                          } while (uVar48 >> 0x1b != uVar39);
                        }
                        pOVar8->Sign = uVar23;
                      }
                    }
                    Of_CutParams(p,pOVar8,iVar54);
                    uVar30 = Of_SetAddCut(local_1938,uVar30,uVar22);
                  }
                }
LAB_00750697:
                pOVar38 = pOVar38 + 1;
              } while (pOVar38 < local_1838 + iVar21);
            }
            local_19b8 = local_19b8 + 1;
          } while (local_19b8 < local_1940);
        }
        pOVar31 = pOVar31 + 1;
      } while (pOVar31 < local_1950);
    }
  }
  if (((int)uVar30 < 1) || ((int)uVar22 <= (int)uVar30)) {
    __assert_fail("nCutsR > 0 && nCutsR < nCutNum",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaOf.c"
                  ,0x304,"void Of_ObjMergeOrder(Of_Man_t *, int)");
  }
  if (((p->vCutFlows).nSize <= iObj) ||
     ((p->vCutFlows).pArray[(uint)iObj] = local_1938[0]->Flow, (p->vCutDelays).nSize <= iObj)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  (p->vCutDelays).pArray[(uint)iObj] = local_1938[0]->Delay;
  iVar54 = 1;
  uVar23 = 0;
  do {
    iVar54 = iVar54 + (*(uint *)&local_1938[uVar23]->field_0x10 >> 0x1b) + 4;
    uVar23 = uVar23 + 1;
  } while (uVar30 != uVar23);
  if (0xffff < (p->iCur & 0xffffU) + iVar54) {
    p->iCur = (p->iCur & 0xffff0000U) + 0x10000;
  }
  uVar1 = (p->vPages).nSize;
  if (uVar1 == (int)*(short *)((long)&p->iCur + 2)) {
    pvVar24 = calloc(0x10000,4);
    uVar22 = (p->vPages).nCap;
    if (uVar1 == uVar22) {
      if ((int)uVar22 < 0x10) {
        ppvVar25 = (p->vPages).pArray;
        if (ppvVar25 == (void **)0x0) {
          ppvVar25 = (void **)malloc(0x80);
        }
        else {
          ppvVar25 = (void **)realloc(ppvVar25,0x80);
        }
        (p->vPages).pArray = ppvVar25;
        iVar18 = 0x10;
      }
      else {
        iVar18 = uVar22 * 2;
        if (iVar18 <= (int)uVar22) goto LAB_007507fe;
        ppvVar25 = (p->vPages).pArray;
        if (ppvVar25 == (void **)0x0) {
          ppvVar25 = (void **)malloc((ulong)uVar22 << 4);
        }
        else {
          ppvVar25 = (void **)realloc(ppvVar25,(ulong)uVar22 << 4);
        }
        (p->vPages).pArray = ppvVar25;
      }
      (p->vPages).nCap = iVar18;
    }
LAB_007507fe:
    iVar18 = (p->vPages).nSize;
    (p->vPages).nSize = iVar18 + 1;
    (p->vPages).pArray[iVar18] = pvVar24;
  }
  uVar1 = p->iCur;
  p->iCur = iVar54 + uVar1;
  uVar22 = (int)uVar1 >> 0x10;
  if ((-1 < (int)uVar22) && ((int)uVar22 < (p->vPages).nSize)) {
    puVar52 = (uint *)((long)(p->vPages).pArray[uVar22] + (ulong)(uVar1 & 0xffff) * 4);
    *puVar52 = uVar30;
    uVar23 = 0;
    puVar52 = puVar52 + 1;
    do {
      pOVar31 = local_1938[uVar23];
      *puVar52 = *(uint *)&pOVar31->field_0x10 << 5 | *(uint *)&pOVar31->field_0x10 >> 0x1b;
      memcpy(puVar52 + 1,pOVar31->pLeaves,
             (ulong)(*(uint *)&pOVar31->field_0x10 >> 0x19 & 0xfffffffc));
      uVar22 = *(uint *)&pOVar31->field_0x10 >> 0x1b;
      (puVar52 + (ulong)uVar22 + 1)[0] = 0xffffffff;
      (puVar52 + (ulong)uVar22 + 1)[1] = 0xffffffff;
      puVar52[(ulong)uVar22 + 3] = 0xffffffff;
      uVar23 = uVar23 + 1;
      puVar52 = puVar52 + (ulong)uVar22 + 4;
    } while (uVar30 != uVar23);
    if (iObj < (p->vCutSets).nSize) {
      (p->vCutSets).pArray[(uint)iObj] = uVar1;
      p->CutCount[3] = (double)(int)uVar30 + p->CutCount[3];
      return;
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
LAB_00750a41:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Of_ObjMergeOrder( Of_Man_t * p, int iObj )
{
    Of_Cut_t pCuts0[OF_CUT_MAX], pCuts1[OF_CUT_MAX], pCuts[OF_CUT_MAX], * pCutsR[OF_CUT_MAX];
    Gia_Obj_t * pObj = Gia_ManObj(p->pGia, iObj);
    int nGiaRefs = 2*Gia_ObjRefNumId(p->pGia, iObj);
    int nLutSize = p->pPars->nLutSize;
    int nCutNum  = p->pPars->nCutNum;
    int nCuts0   = Of_ManPrepareCuts(pCuts0, p, Gia_ObjFaninId0(pObj, iObj), 1);
    int nCuts1   = Of_ManPrepareCuts(pCuts1, p, Gia_ObjFaninId1(pObj, iObj), 1);
    int fComp0   = Gia_ObjFaninC0(pObj);
    int fComp1   = Gia_ObjFaninC1(pObj);
    int iSibl    = Gia_ObjSibl(p->pGia, iObj);
    Of_Cut_t * pCut0, * pCut1, * pCut0Lim = pCuts0 + nCuts0, * pCut1Lim = pCuts1 + nCuts1;
    int i, nCutsR = 0;
    assert( !Gia_ObjIsBuf(pObj) );
    for ( i = 0; i < nCutNum; i++ )
        pCutsR[i] = pCuts + i;
    if ( iSibl )
    {
        Of_Cut_t pCuts2[OF_CUT_MAX];
        Gia_Obj_t * pObjE = Gia_ObjSiblObj(p->pGia, iObj);
        int fCompE = Gia_ObjPhase(pObj) ^ Gia_ObjPhase(pObjE);
        int nCuts2 = Of_ManPrepareCuts(pCuts2, p, iSibl, 0);
        Of_Cut_t * pCut2, * pCut2Lim = pCuts2 + nCuts2;
        for ( pCut2 = pCuts2; pCut2 < pCut2Lim; pCut2++ )
        {
            *pCutsR[nCutsR] = *pCut2;
            if ( p->pPars->fCutMin )
                pCutsR[nCutsR]->iFunc = Abc_LitNotCond( pCutsR[nCutsR]->iFunc, fCompE );
            Of_CutParams( p, pCutsR[nCutsR], nGiaRefs );
            nCutsR = Of_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    if ( Gia_ObjIsMuxId(p->pGia, iObj) )
    {
        Of_Cut_t pCuts2[OF_CUT_MAX];
        int nCuts2  = Of_ManPrepareCuts(pCuts2, p, Gia_ObjFaninId2(p->pGia, iObj), 1);
        int fComp2  = Gia_ObjFaninC2(p->pGia, pObj);
        Of_Cut_t * pCut2, * pCut2Lim = pCuts2 + nCuts2;
        p->CutCount[0] += nCuts0 * nCuts1 * nCuts2;
        for ( pCut0 = pCuts0; pCut0 < pCut0Lim; pCut0++ )
        for ( pCut1 = pCuts1; pCut1 < pCut1Lim; pCut1++ )
        for ( pCut2 = pCuts2; pCut2 < pCut2Lim; pCut2++ )
        {
            if ( Of_CutCountBits(pCut0->Sign | pCut1->Sign | pCut2->Sign) > nLutSize )
                continue;
            p->CutCount[1]++; 
            if ( !Of_CutMergeOrderMux(pCut0, pCut1, pCut2, pCutsR[nCutsR], nLutSize) )
                continue;
            if ( Of_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
            p->CutCount[2]++;
            if ( p->pPars->fCutMin && Of_CutComputeTruthMux6(p, pCut0, pCut1, pCut2, fComp0, fComp1, fComp2, pCutsR[nCutsR]) )
                pCutsR[nCutsR]->Sign = Of_CutGetSign(pCutsR[nCutsR]->pLeaves, pCutsR[nCutsR]->nLeaves);
            Of_CutParams( p, pCutsR[nCutsR], nGiaRefs );
            nCutsR = Of_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    else
    {
        int fIsXor = Gia_ObjIsXor(pObj);
        p->CutCount[0] += nCuts0 * nCuts1;
        for ( pCut0 = pCuts0; pCut0 < pCut0Lim; pCut0++ )
        for ( pCut1 = pCuts1; pCut1 < pCut1Lim; pCut1++ )
        {
            if ( (int)(pCut0->nLeaves + pCut1->nLeaves) > nLutSize && Of_CutCountBits(pCut0->Sign | pCut1->Sign) > nLutSize )
                continue;
            p->CutCount[1]++; 
            if ( !Of_CutMergeOrder(pCut0, pCut1, pCutsR[nCutsR], nLutSize) )
                continue;
            if ( Of_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
            p->CutCount[2]++;
            if ( p->pPars->fCutMin && Of_CutComputeTruth6(p, pCut0, pCut1, fComp0, fComp1, pCutsR[nCutsR], fIsXor) )
                pCutsR[nCutsR]->Sign = Of_CutGetSign(pCutsR[nCutsR]->pLeaves, pCutsR[nCutsR]->nLeaves);
            Of_CutParams( p, pCutsR[nCutsR], nGiaRefs );
            nCutsR = Of_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    // debug printout
    if ( 0 )
    {
        printf( "*** Obj = %d\n", iObj );
        for ( i = 0; i < nCutsR; i++ )
            Of_Cutprintf( p, pCutsR[i] );
        printf( "\n" );
    } 
    // verify
    assert( nCutsR > 0 && nCutsR < nCutNum );
    //assert( Of_SetCheckArray(pCutsR, nCutsR) );
    // store the cutset
    Of_ObjSetCutFlow( p, iObj, pCutsR[0]->Flow );
    Of_ObjSetCutDelay( p, iObj, pCutsR[0]->Delay );
    *Vec_IntEntryP(&p->vCutSets, iObj) = Of_ManSaveCuts(p, pCutsR, nCutsR);
    p->CutCount[3] += nCutsR;
}